

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O2

ssize_t tnt_object_add_uint(tnt_stream *s,uint64_t value)

{
  int *piVar1;
  byte bVar2;
  long *plVar3;
  char *pcVar4;
  ssize_t sVar5;
  char local_22 [8];
  char data [10];
  
  plVar3 = *(long **)((long)s->data + 0x30);
  bVar2 = *(byte *)(plVar3 + 1);
  if (bVar2 != 0) {
    piVar1 = (int *)(*plVar3 + 8 + (ulong)(bVar2 - 1) * 0x10);
    *piVar1 = *piVar1 + 1;
  }
  pcVar4 = mp_encode_uint(local_22,value);
  sVar5 = (*s->write)(s,local_22,(long)pcVar4 - (long)local_22);
  return sVar5;
}

Assistant:

ssize_t
tnt_object_add_uint(struct tnt_stream *s, uint64_t value)
{
	struct tnt_sbuf_object *sbo = TNT_SOBJ_CAST(s);
	if (sbo->stack_size > 0)
		sbo->stack[sbo->stack_size - 1].size += 1;
	char data[10], *end;
	end = mp_encode_uint(data, value);
	return s->write(s, data, end - data);
}